

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  ParseLocation location;
  Finder *pFVar1;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  Descriptor *this_00;
  FieldDescriptor *field;
  FieldDescriptor *pFVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  LogMessage *other;
  string *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string part;
  allocator<char> local_b2;
  allocator<char> local_b1;
  Reflection *local_b0;
  Message *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string field_name;
  undefined4 extraout_var_00;
  
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  local_b0 = (Reflection *)CONCAT44(extraout_var,iVar5);
  local_a8 = message;
  iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  this_00 = (Descriptor *)CONCAT44(extraout_var_00,iVar5);
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  location.line = (this->tokenizer_).current_.line;
  location.column = (this->tokenizer_).current_.column;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&part,"[",(allocator<char> *)&local_110);
  bVar2 = TryConsume(this,&part);
  std::__cxx11::string::~string((string *)&part);
  if (bVar2) {
    bVar2 = ConsumeIdentifier(this,&field_name);
    if (bVar2) {
      while( true ) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&part,".",(allocator<char> *)&local_110);
        bVar2 = TryConsume(this,&part);
        std::__cxx11::string::~string((string *)&part);
        if (!bVar2) break;
        part._M_dataplus._M_p = (pointer)&part.field_2;
        part._M_string_length = 0;
        part.field_2._M_local_buf[0] = '\0';
        bVar2 = ConsumeIdentifier(this,&part);
        if (!bVar2) {
          psVar7 = &part;
          goto LAB_001c5ade;
        }
        std::__cxx11::string::append((char *)&field_name);
        std::__cxx11::string::append((string *)&field_name);
        std::__cxx11::string::~string((string *)&part);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&part,"]",(allocator<char> *)&local_110);
      bVar2 = Consume(this,&part);
      std::__cxx11::string::~string((string *)&part);
      if (bVar2) {
        pFVar1 = this->finder_;
        if (pFVar1 == (Finder *)0x0) {
          iVar5 = (*local_b0->_vptr_Reflection[0x42])(local_b0,&field_name);
          field = (FieldDescriptor *)CONCAT44(extraout_var_02,iVar5);
        }
        else {
          iVar5 = (*pFVar1->_vptr_Finder[2])(pFVar1,local_a8,&field_name);
          field = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar5);
        }
        if (field == (FieldDescriptor *)0x0) {
          if (this->allow_unknown_field_ == false) {
            std::operator+(&local_80,"Extension \"",&field_name);
            std::operator+(&local_a0,&local_80,"\" is not defined or is not an extension of \"");
            std::operator+(&local_110,&local_a0,
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (this_00 + 8));
            std::operator+(&part,&local_110,"\".");
            ReportError(this,&part);
            goto LAB_001c5ab8;
          }
          std::operator+(&local_80,"Extension \"",&field_name);
          std::operator+(&local_a0,&local_80,"\" is not defined or is not an extension of \"");
          std::operator+(&local_110,&local_a0,
                         *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                          (this_00 + 8));
          std::operator+(&part,&local_110,"\".");
          ReportWarning(this,&part);
          goto LAB_001c5906;
        }
LAB_001c55bc:
        if (((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
            (*(int *)(field + 0x30) != 3)) &&
           (iVar5 = (*local_b0->_vptr_Reflection[5])(local_b0,local_a8,field), (char)iVar5 != '\0'))
        {
          std::operator+(&local_110,"Non-repeated field \"",&field_name);
          std::operator+(&part,&local_110,"\" is specified multiple times.");
          ReportError(this,&part);
          std::__cxx11::string::~string((string *)&part);
          psVar7 = &local_110;
          goto LAB_001c5ade;
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) == 10)
        {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&part,":",(allocator<char> *)&local_110);
          TryConsume(this,&part);
          std::__cxx11::string::~string((string *)&part);
          bVar2 = ConsumeFieldMessage(this,local_a8,local_b0,field);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&part,":",(allocator<char> *)&local_110);
          bVar2 = Consume(this,&part);
          std::__cxx11::string::~string((string *)&part);
          if (!bVar2) goto LAB_001c5ae3;
          if (*(int *)(field + 0x30) == 3) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&part,"[",(allocator<char> *)&local_110);
            bVar2 = TryConsume(this,&part);
            std::__cxx11::string::~string((string *)&part);
            if (bVar2) {
              do {
                bVar2 = ConsumeFieldValue(this,local_a8,local_b0,field);
                if (!bVar2) goto LAB_001c5ae3;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&part,"]",(allocator<char> *)&local_110);
                bVar2 = TryConsume(this,&part);
                std::__cxx11::string::~string((string *)&part);
                if (bVar2) goto LAB_001c57ad;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&part,",",(allocator<char> *)&local_110);
                bVar2 = Consume(this,&part);
                std::__cxx11::string::~string((string *)&part);
                bVar4 = false;
              } while (bVar2);
              goto LAB_001c5ae5;
            }
          }
          bVar2 = ConsumeFieldValue(this,local_a8,local_b0,field);
        }
        if (bVar2 != false) {
LAB_001c57ad:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&part,";",(allocator<char> *)&local_a0);
          bVar2 = TryConsume(this,&part);
          if (!bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_110,",",(allocator<char> *)&local_80);
            TryConsume(this,&local_110);
            std::__cxx11::string::~string((string *)&local_110);
          }
          std::__cxx11::string::~string((string *)&part);
          if (*(char *)(*(long *)(field + 0x60) + 0x46) == '\x01') {
            std::operator+(&local_110,"text format contains deprecated field \"",&field_name);
            std::operator+(&part,&local_110,"\"");
            ReportWarning(this,&part);
            std::__cxx11::string::~string((string *)&part);
            std::__cxx11::string::~string((string *)&local_110);
          }
          bVar4 = true;
          if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
            ParseInfoTree::RecordLocation(this->parse_info_tree_,field,location);
          }
          goto LAB_001c5ae5;
        }
      }
    }
  }
  else {
    bVar2 = ConsumeIdentifier(this,&field_name);
    if (!bVar2) goto LAB_001c5ae3;
    field = Descriptor::FindFieldByName(this_00,&field_name);
    if (field == (FieldDescriptor *)0x0) {
      std::__cxx11::string::string((string *)&part,(string *)&field_name);
      LowerString(&part);
      pFVar6 = Descriptor::FindFieldByName(this_00,&part);
      field = (FieldDescriptor *)0x0;
      if ((pFVar6 != (FieldDescriptor *)0x0) && (*(int *)(pFVar6 + 0x2c) == 10)) {
        field = pFVar6;
      }
      std::__cxx11::string::~string((string *)&part);
      if (field != (FieldDescriptor *)0x0) goto LAB_001c5413;
    }
    else {
LAB_001c5413:
      if ((*(int *)(field + 0x2c) != 10) ||
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)**(undefined8 **)(field + 0x48),&field_name), !bVar2))
      goto LAB_001c55bc;
    }
    if (this->allow_unknown_field_ != false) {
      std::operator+(&local_80,"Message type \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (this_00 + 8));
      std::operator+(&local_a0,&local_80,"\" has no field named \"");
      std::operator+(&local_110,&local_a0,&field_name);
      std::operator+(&part,&local_110,"\".");
      ReportWarning(this,&part);
LAB_001c5906:
      std::__cxx11::string::~string((string *)&part);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      if (this->allow_unknown_field_ == false) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&part,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/text_format.cc"
                   ,0x17e);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)&part,"CHECK failed: allow_unknown_field_: ");
        internal::LogFinisher::operator=((LogFinisher *)&local_110,other);
        internal::LogMessage::~LogMessage((LogMessage *)&part);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&part,":",(allocator<char> *)&local_80);
      bVar2 = TryConsume(this,&part);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"{",&local_b1);
        psVar7 = &(this->tokenizer_).current_.text;
        _Var3 = std::operator==(psVar7,&local_110);
        if (_Var3) {
          std::__cxx11::string::~string((string *)&local_110);
          goto LAB_001c59db;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"<",&local_b2);
        _Var3 = std::operator==(psVar7,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&part);
        if (!_Var3) {
          bVar4 = SkipFieldValue(this);
          goto LAB_001c5ae5;
        }
      }
      else {
LAB_001c59db:
        std::__cxx11::string::~string((string *)&part);
      }
      bVar4 = SkipFieldMessage(this);
      goto LAB_001c5ae5;
    }
    std::operator+(&local_80,"Message type \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (this_00 + 8));
    std::operator+(&local_a0,&local_80,"\" has no field named \"");
    std::operator+(&local_110,&local_a0,&field_name);
    std::operator+(&part,&local_110,"\".");
    ReportError(this,&part);
LAB_001c5ab8:
    std::__cxx11::string::~string((string *)&part);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_a0);
    psVar7 = &local_80;
LAB_001c5ade:
    std::__cxx11::string::~string((string *)psVar7);
  }
LAB_001c5ae3:
  bVar4 = false;
LAB_001c5ae5:
  std::__cxx11::string::~string((string *)&field_name);
  return bVar4;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    string field_name;

    const FieldDescriptor* field = NULL;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeIdentifier(&field_name));
      while (TryConsume(".")) {
        string part;
        DO(ConsumeIdentifier(&part));
        field_name += ".";
        field_name += part;
      }
      DO(Consume("]"));

      field = (finder_ != NULL
               ? finder_->FindExtension(message, field_name)
               : reflection->FindKnownExtensionByName(field_name));

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Extension \"" + field_name + "\" is not defined or "
                      "is not an extension of \"" +
                      descriptor->full_name() + "\".");
          return false;
        } else {
          ReportWarning("Extension \"" + field_name + "\" is not defined or "
                        "is not an extension of \"" +
                        descriptor->full_name() + "\".");
        }
      }
    } else {
      DO(ConsumeIdentifier(&field_name));

      field = descriptor->FindFieldByName(field_name);
      // Group names are expected to be capitalized as they appear in the
      // .proto file, which actually matches their type names, not their field
      // names.
      if (field == NULL) {
        string lower_field_name = field_name;
        LowerString(&lower_field_name);
        field = descriptor->FindFieldByName(lower_field_name);
        // If the case-insensitive match worked but the field is NOT a group,
        if (field != NULL && field->type() != FieldDescriptor::TYPE_GROUP) {
          field = NULL;
        }
      }
      // Again, special-case group names as described above.
      if (field != NULL && field->type() == FieldDescriptor::TYPE_GROUP
          && field->message_type()->name() != field_name) {
        field = NULL;
      }

      if (field == NULL) {
        if (!allow_unknown_field_) {
          ReportError("Message type \"" + descriptor->full_name() +
                      "\" has no field named \"" + field_name + "\".");
          return false;
        } else {
          ReportWarning("Message type \"" + descriptor->full_name() +
                        "\" has no field named \"" + field_name + "\".");
        }
      }
    }

    // Skips unknown field.
    if (field == NULL) {
      GOOGLE_CHECK(allow_unknown_field_);
      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the begining of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
        return SkipFieldValue();
      } else {
        return SkipFieldMessage();
      }
    }

    // Fail if the field is not repeated and it has already been specified.
    if ((singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
        !field->is_repeated() && reflection->HasField(*message, field)) {
      ReportError("Non-repeated field \"" + field_name +
                  "\" is specified multiple times.");
      return false;
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      TryConsume(":");
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(Consume(":"));
      if (field->is_repeated() && TryConsume("[")) {
        // Short repeated format, e.g.  "foo: [1, 2, 3]"
        while (true) {
          DO(ConsumeFieldValue(message, reflection, field));
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      } else {
        DO(ConsumeFieldValue(message, reflection, field));
      }
    }

    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    if (field->options().deprecated()) {
      ReportWarning("text format contains deprecated field \""
                    + field_name + "\"");
    }

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != NULL) {
      RecordLocation(parse_info_tree_, field,
                     ParseLocation(start_line, start_column));
    }

    return true;
  }